

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureWeight::ByteSizeLong
          (BayesianProbitRegressor_FeatureWeight *this)

{
  long lVar1;
  Rep *pRVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  void **ppvVar9;
  
  sVar7 = (size_t)(this->weights_).super_RepeatedPtrFieldBase.current_size_;
  pRVar2 = (this->weights_).super_RepeatedPtrFieldBase.rep_;
  ppvVar9 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar9 = (void **)0x0;
  }
  lVar1 = sVar7 * 8;
  for (lVar8 = 0; lVar1 - lVar8 != 0; lVar8 = lVar8 + 8) {
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight>
                      (*(BayesianProbitRegressor_FeatureValueWeight **)((long)ppvVar9 + lVar8));
    sVar7 = sVar7 + sVar6;
  }
  if (this->featureid_ != 0) {
    uVar5 = this->featureid_ | 1;
    iVar4 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    sVar7 = sVar7 + (iVar4 * 9 + 0x89U >> 6);
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    sVar7 = sVar7 + *(long *)((uVar3 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar7;
  return sVar7;
}

Assistant:

size_t BayesianProbitRegressor_FeatureWeight::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BayesianProbitRegressor.FeatureWeight)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.BayesianProbitRegressor.FeatureValueWeight weights = 2;
  total_size += 1UL * this->_internal_weights_size();
  for (const auto& msg : this->weights_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // uint32 featureId = 1;
  if (this->_internal_featureid() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt32SizePlusOne(this->_internal_featureid());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}